

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

void directed_flag_complex_computer::prepare_graph_filtration<directed_flag_complex_t>
               (directed_flag_complex_t *complex,filtered_directed_graph_t *graph,
               filtration_algorithm_t *filtration_algorithm,size_t nb_threads)

{
  pointer pfVar1;
  unsigned_short *puVar2;
  pointer puVar3;
  float *pfVar4;
  ushort uVar5;
  int iVar6;
  ostream *poVar7;
  __buckets_ptr pp_Var8;
  byte bVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  unsigned_short *puVar13;
  float *pfVar14;
  size_t i;
  ulong uVar15;
  __buckets_ptr pp_Var16;
  bool bVar17;
  float extraout_XMM0_Da;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  new_edges;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  new_filtrations;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> empty;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> hash;
  vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  reorder_filtration;
  
  if (filtration_algorithm == (filtration_algorithm_t *)0x0) {
    empty.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._0_8_ = empty.
                  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                  ._M_h._0_8_ & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&hash,
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&empty,
               (allocator_type *)&new_edges);
    std::vector<float,_std::allocator<float>_>::_M_move_assign(&graph->vertex_filtration,&hash);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&hash);
LAB_00148243:
    bVar9 = 0;
  }
  else {
    iVar6 = (*filtration_algorithm->_vptr_filtration_algorithm_t[3])(filtration_algorithm);
    if ((char)iVar6 != '\0') {
      hash.
      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
      ._M_h._0_8_ = &PTR_vertex_0015d298;
      uVar5 = 0;
      while (empty.
             super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
             ._M_h._0_2_ = uVar5, uVar5 < (graph->super_directed_graph_t).number_of_vertices) {
        hash.
        super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
        ._M_h._M_buckets = (__buckets_ptr)&empty;
        (*filtration_algorithm->_vptr_filtration_algorithm_t[2])
                  (filtration_algorithm,0,&hash,graph,0);
        (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start
        [empty.
         super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
         ._M_h._0_8_ & 0xffff] = extraout_XMM0_Da;
        uVar5 = empty.
                super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                ._M_h._0_2_ + 1;
      }
    }
    if ((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar6 = (*filtration_algorithm->_vptr_filtration_algorithm_t[4])(filtration_algorithm);
      if ((char)iVar6 == '\0') goto LAB_00148243;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    std::operator<<(poVar7,"computing the filtration of all edges");
    poVar7 = (ostream *)std::ostream::flush();
    std::operator<<(poVar7,"\r");
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
              *)&empty,0,(allocator_type *)&hash);
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_element_count = (size_type)&graph->vertex_filtration;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._0_4_ = 0xffffffff;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_bucket_count = 0;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_buckets = (__buckets_ptr)graph;
    hash.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)filtration_algorithm;
    std::
    vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
    ::vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
              *)&new_edges,nb_threads,(value_type *)&hash,(allocator_type *)&new_filtrations);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)
               &hash.
                super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                ._M_h._M_rehash_policy);
    directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::compute_filtration_t>
              (complex,(vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                        *)&new_edges,1,-1);
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    std::vector<float,_std::allocator<float>_>::reserve
              (&graph->edge_filtration,
               (ulong)((long)(graph->super_directed_graph_t).edges.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(graph->super_directed_graph_t).edges.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1) >> 1);
    for (sVar10 = 0; sVar10 != nb_threads; sVar10 = sVar10 + 1) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&hash,
                 (vector<float,_std::allocator<float>_> *)
                 ((long)new_edges.
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + sVar10 * 0x58 + 0x28));
      pp_Var8 = hash.
                super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                ._M_h._M_buckets;
      for (pp_Var16 = (__buckets_ptr)
                      hash.
                      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                      ._M_h._0_8_; pp_Var16 != pp_Var8;
          pp_Var16 = (__buckets_ptr)((long)pp_Var16 + 4)) {
        new_filtrations.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)pp_Var16;
        std::vector<float,_std::allocator<float>_>::push_back
                  (&graph->edge_filtration,(value_type_conflict2 *)&new_filtrations);
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&hash);
    }
    std::
    vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
    ::~vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
               *)&new_edges);
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
               *)&empty);
    bVar9 = 1;
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&new_edges,nb_threads,(allocator_type *)&hash);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&new_filtrations,nb_threads,(allocator_type *)&hash);
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_buckets =
       &hash.
        super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
        ._M_h._M_single_bucket;
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._0_8_ = hash.
                super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                ._M_h._0_8_ & 0xffffffffffffff00;
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_bucket_count = 1;
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_element_count = 0;
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  hash.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (filtration_algorithm != (filtration_algorithm_t *)0x0) {
    cell_hasher_t::dimension = 1;
    pp_Var8 = (__buckets_ptr)
              (graph->super_directed_graph_t).edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var16 = pp_Var8;
    for (uVar15 = 0;
        uVar15 < (ulong)((long)(graph->super_directed_graph_t).edges.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var8 >> 1) >> 1;
        uVar15 = uVar15 + 1) {
      empty.
      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
      ._M_h._0_8_ = &PTR_vertex_0015d298;
      empty.
      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
      ._M_h._M_buckets = pp_Var16;
      empty.
      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
      ._M_h._M_bucket_count = uVar15;
      std::
      _Hashtable<directed_flag_complex_cell_t,std::pair<directed_flag_complex_cell_t_const,unsigned_long>,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>,std::__detail::_Select1st,cell_comparer_t,cell_hasher_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<directed_flag_complex_cell_t,unsigned_long>>
                ((_Hashtable<directed_flag_complex_cell_t,std::pair<directed_flag_complex_cell_t_const,unsigned_long>,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>,std::__detail::_Select1st,cell_comparer_t,cell_hasher_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&hash,&empty);
      pp_Var16 = (__buckets_ptr)((long)pp_Var16 + 4);
      pp_Var8 = (__buckets_ptr)
                (graph->super_directed_graph_t).edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
  }
  reorder_filtration.
  super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reorder_filtration.
  super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reorder_filtration.
  super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 0;
  sVar10 = nb_threads;
  while (bVar17 = sVar10 != 0, sVar10 = sVar10 - 1, bVar17) {
    empty.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ((long)&((new_edges.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar11);
    empty.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_bucket_count =
         CONCAT44(new_filtrations.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                  new_filtrations.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar11;
    empty.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._0_8_ = &hash;
    empty.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_element_count =
         CONCAT71(empty.
                  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                  ._M_h._M_element_count._1_7_,
                  (bVar9 ^ 1) & filtration_algorithm != (filtration_algorithm_t *)0x0);
    empty.
    super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
    ._M_h._M_buckets = (__buckets_ptr)&graph->edge_filtration;
    std::
    vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
    ::emplace_back<directed_flag_complex_computer::reorder_edges_t>
              (&reorder_filtration,(reorder_edges_t *)&empty);
    lVar11 = lVar11 + 0x18;
  }
  directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::reorder_edges_t>
            (complex,&reorder_filtration,1,-1);
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)&hash);
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_buckets =
       &empty.
        super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
        ._M_h._M_single_bucket;
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._0_8_ = empty.
                super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                ._M_h._0_8_ & 0xffffffffffffff00;
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_bucket_count = 1;
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_element_count = 0;
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  empty.
  super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::swap<hash_map<directed_flag_complex_cell_t,unsigned_long,cell_hasher_t,cell_comparer_t>>
            (&hash,&empty);
  lVar11 = 0;
  lVar12 = 0;
  for (sVar10 = 0; sVar10 != nb_threads; sVar10 = sVar10 + 1) {
    if (bVar9 == 0) {
      pfVar4 = *(float **)
                (CONCAT44(new_filtrations.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          new_filtrations.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8 + sVar10 * 0x18);
      pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pfVar14 = *(float **)
                      (CONCAT44(new_filtrations.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                new_filtrations.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_) + sVar10 * 0x18);
          pfVar14 != pfVar4; pfVar14 = pfVar14 + 1) {
        pfVar1[lVar11] = *pfVar14;
        lVar11 = lVar11 + 1;
      }
    }
    puVar2 = new_edges.
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar10].
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (graph->super_directed_graph_t).edges.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (puVar13 = new_edges.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar10].
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar13 != puVar2; puVar13 = puVar13 + 1) {
      puVar3[lVar12] = *puVar13;
      lVar12 = lVar12 + 1;
    }
  }
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&empty);
  std::
  _Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ::~_Vector_base(&reorder_filtration.
                   super__Vector_base<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
                 );
  std::
  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&hash);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&new_filtrations);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&new_edges);
  return;
}

Assistant:

void prepare_graph_filtration(Complex& complex, filtered_directed_graph_t& graph,
                              filtration_algorithm_t* filtration_algorithm, const size_t nb_threads) {
	if (filtration_algorithm == nullptr) {
		// All vertices get the trivial filtration value
		graph.vertex_filtration = std::vector<value_t>(graph.vertex_filtration.size(), 0);
	} else {
		if (filtration_algorithm->overwrite_vertex_filtration()) {
			directed_flag_complex_cell_t cell;
			for (vertex_index_t v = 0; v < graph.number_of_vertices; v++) {
				cell.set_vertices(&v);
				graph.vertex_filtration[v] = filtration_algorithm->compute_filtration(0, cell, graph, nullptr);
			}
		}
	}

	bool computed_edge_filtration = false;
	if (filtration_algorithm != nullptr &&
	    (graph.edge_filtration.size() == 0 || filtration_algorithm->overwrite_edge_filtration())) {
		computed_edge_filtration = true;
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing the filtration of all edges" << std::flush << "\r";
#endif

		// Dummy parameter because we pass by reference the argument and
		// It cannot take a default value
		std::vector<cell_hash_map_t> tmp(0);
		std::vector<compute_filtration_t> compute_filtration(
		    nb_threads, compute_filtration_t(filtration_algorithm, graph, graph.vertex_filtration, tmp, nb_threads));
		complex.for_each_cell(compute_filtration, 1);
		graph.edge_filtration.clear();
		graph.edge_filtration.reserve(graph.edge_number());
		for (size_t i = 0; i < nb_threads; i++) {
			for (auto f : compute_filtration[i].filtration()) graph.edge_filtration.push_back(f);
		}
	}

	// Now, we reorder the edges and their filtration value such that it matches
	// the iteration order of "for_each_cell"
	std::vector<std::vector<vertex_index_t>> new_edges(nb_threads);
	std::vector<std::vector<value_t>> new_filtrations(nb_threads);

	hash_map<directed_flag_complex_cell_t, size_t, cell_hasher_t, cell_comparer_t> hash;
	if (filtration_algorithm != nullptr) {
		cell_hasher_t::set_current_cell_dimension(1);
		vertex_index_t* e = &(graph.edges[0]);
		directed_flag_complex_cell_t c;
		for (size_t i = 0; i < graph.edges.size() / 2; ++i, e += 2) {
			c.set_vertices(e);
			hash.insert(std::make_pair(c, i));
		}
	}

	std::vector<reorder_edges_t> reorder_filtration;
	for (size_t i = 0; i < nb_threads; i++) {
		reorder_filtration.push_back(reorder_edges_t(new_edges[i],
		                                             !computed_edge_filtration && filtration_algorithm != nullptr, hash,
		                                             graph.edge_filtration, new_filtrations[i]));
	}
	complex.for_each_cell(reorder_filtration, 1);

	hash.clear();
	hash_map<directed_flag_complex_cell_t, size_t, cell_hasher_t, cell_comparer_t> empty;
	std::swap(hash, empty);

	size_t current_filtration_index = 0;
	size_t current_edge_index = 0;
	for (size_t i = 0; i < nb_threads; i++) {
		if (!computed_edge_filtration)
			for (auto f : new_filtrations[i]) graph.edge_filtration[current_filtration_index++] = f;
		for (auto e : new_edges[i]) graph.edges[current_edge_index++] = e;
	}
}